

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoding_backend_init_file__stbvorbis
                    (void *pUserData,char *pFilePath,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_result mVar1;
  ma_stbvorbis *pVorbis;
  ma_allocation_callbacks *pAllocationCallbacks_00;
  ma_allocation_callbacks *pConfig_00;
  
  pConfig_00 = pAllocationCallbacks;
  pVorbis = (ma_stbvorbis *)ma_malloc(0xe0,pAllocationCallbacks);
  if (pVorbis == (ma_stbvorbis *)0x0) {
    mVar1 = MA_OUT_OF_MEMORY;
  }
  else {
    mVar1 = ma_stbvorbis_init_file
                      (pFilePath,(ma_decoding_backend_config *)pConfig_00,pAllocationCallbacks_00,
                       pVorbis);
    if (mVar1 == MA_SUCCESS) {
      *ppBackend = pVorbis;
      mVar1 = MA_SUCCESS;
    }
    else {
      ma_free(pVorbis,pAllocationCallbacks);
    }
  }
  return mVar1;
}

Assistant:

static ma_result ma_decoding_backend_init_file__stbvorbis(void* pUserData, const char* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_stbvorbis* pVorbis;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pVorbis = (ma_stbvorbis*)ma_malloc(sizeof(*pVorbis), pAllocationCallbacks);
    if (pVorbis == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_stbvorbis_init_file(pFilePath, pConfig, pAllocationCallbacks, pVorbis);
    if (result != MA_SUCCESS) {
        ma_free(pVorbis, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pVorbis;

    return MA_SUCCESS;
}